

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uct_node.cpp
# Opt level: O2

void __thiscall megumax::UCTNode::create_children(UCTNode *this,Position *pos,MoveList *move_list)

{
  pointer pMVar1;
  double *pdVar2;
  double *prob;
  double *pdVar3;
  Move *move;
  pointer pMVar4;
  double dVar5;
  UCTNode *pUVar6;
  UCTNode *local_58;
  MoveList *local_50;
  Position *local_48;
  UCTNode *local_40;
  double local_38;
  
  local_48 = pos;
  std::vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>::reserve
            (&this->children_,
             (long)(int)((ulong)((long)(move_list->values_).
                                       super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(move_list->values_).
                                      super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2));
  std::vector<double,_std::allocator<double>_>::reserve
            (&this->probabilities_,
             (long)(int)((ulong)((long)(move_list->values_).
                                       super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(move_list->values_).
                                      super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2));
  pMVar1 = (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_38 = 0.0;
  local_50 = move_list;
  for (pMVar4 = (move_list->values_).
                super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
                super__Vector_impl_data._M_start; pMVar4 != pMVar1; pMVar4 = pMVar4 + 1) {
    local_58 = this;
    std::vector<megumax::UCTNode,std::allocator<megumax::UCTNode>>::
    emplace_back<libchess::Move_const&,megumax::UCTNode*>
              ((vector<megumax::UCTNode,std::allocator<megumax::UCTNode>> *)&this->children_,pMVar4,
               &local_58);
    dVar5 = p((this->children_).
              super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>._M_impl.
              super__Vector_impl_data._M_finish + -1,local_48);
    pUVar6 = (UCTNode *)0x3ff0000000000000;
    if (dVar5 < 30.0) {
      pUVar6 = (UCTNode *)exp(dVar5);
    }
    local_58 = pUVar6;
    local_40 = pUVar6;
    std::vector<double,_std::allocator<double>_>::push_back
              (&this->probabilities_,(value_type_conflict2 *)&local_58);
    local_38 = local_38 + (double)local_40;
  }
  pMVar4 = (local_50->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pMVar1 = (local_50->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar2 = (this->probabilities_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar3 = (this->probabilities_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar3 != pdVar2; pdVar3 = pdVar3 + 1) {
    if ((local_38 != 0.0) ||
       (dVar5 = 1.0 / (double)(int)((ulong)((long)pMVar4 - (long)pMVar1) >> 2), NAN(local_38))) {
      dVar5 = *pdVar3 / local_38;
    }
    *pdVar3 = dVar5;
  }
  return;
}

Assistant:

void UCTNode::create_children(libchess::Position& pos,
                              const libchess::MoveList& move_list) noexcept {
    children_.reserve(move_list.size());
    probabilities_.reserve(move_list.size());

    double sum = 0.0;
    for (const libchess::Move& move : move_list.values()) {
        assert(pos.is_legal_move(move));

        children_.emplace_back(move, this);

        double score = children_.back().p(pos);
        if (score >= 30) {
            score = 1.0;
        } else {
            score = std::exp(score);
        }
        assert(score >= 0.0);
        assert(!std::isnan(score));
        sum += score;

        probabilities_.push_back(score);
    }

    // Softmax
    for (auto& prob : probabilities_) {
        if (sum == 0.0) {
            prob = 1.0 / move_list.size();
        } else {
            prob = prob / sum;
        }
        assert(0.0 <= prob && prob <= 1.0);
    }

#ifndef NDEBUG
    double nsum = 0.0;
    for (auto& prob : probabilities_) {
        nsum += prob;
    }
    assert(std::abs(nsum - 1.0) <= 0.001);
#endif
}